

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImRect IVar6;
  
  IVar6 = ImGuiWindow::Rect(window);
  fVar1 = IVar6.Max.x;
  fVar2 = IVar6.Max.y;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    fVar1 = fVar1 + -1.0;
    fVar2 = fVar2 + -1.0;
  }
  fVar3 = IVar6.Min.x;
  fVar5 = IVar6.Min.y;
  switch(border_n) {
  case 0:
    break;
  case 1:
    fVar3 = fVar1;
    break;
  case 2:
    goto LAB_0016edb4;
  case 3:
    fVar5 = fVar2;
LAB_0016edb4:
    fVar4 = fVar5 - thickness;
    fVar3 = fVar3 + perp_padding;
    fVar5 = fVar5 + thickness;
    fVar1 = fVar1 - perp_padding;
    goto LAB_0016ede8;
  default:
    fVar3 = 0.0;
    fVar4 = 0.0;
    fVar1 = 0.0;
    fVar5 = 0.0;
    goto LAB_0016ede8;
  }
  fVar4 = fVar5 + perp_padding;
  fVar5 = fVar2 - perp_padding;
  fVar1 = thickness + fVar3;
  fVar3 = fVar3 - thickness;
LAB_0016ede8:
  IVar6.Min.y = fVar4;
  IVar6.Min.x = fVar3;
  IVar6.Max.y = fVar5;
  IVar6.Max.x = fVar1;
  return IVar6;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f)
        rect.Max -= ImVec2(1, 1);
    if (border_n == ImGuiDir_Left)  { return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding); }
    if (border_n == ImGuiDir_Right) { return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding); }
    if (border_n == ImGuiDir_Up)    { return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);    }
    if (border_n == ImGuiDir_Down)  { return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);    }
    IM_ASSERT(0);
    return ImRect();
}